

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall
QDockAreaLayout::splitDockWidget
          (QDockAreaLayout *this,QDockWidget *after,QDockWidget *dockWidget,Orientation orientation)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  QLayoutItem *dockWidgetItem;
  long in_FS_OFFSET;
  QString local_70;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf(&local_58,this,&after->super_QWidget);
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    this_00 = info(this,&local_58);
    index = local_58.d.ptr[(long)(local_58.d.size + -1)];
    dockWidgetItem = (QLayoutItem *)operator_new(0x18);
    QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)dockWidgetItem,dockWidget);
    QDockAreaLayoutInfo::split(this_00,index,orientation,dockWidgetItem);
    QObject::objectName();
    removePlaceHolder(this,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::splitDockWidget(QDockWidget *after,
                                               QDockWidget *dockWidget,
                                               Qt::Orientation orientation)
{
    const QList<int> path = indexOf(after);
    if (path.isEmpty())
        return;

    QDockAreaLayoutInfo *info = this->info(path);
    Q_ASSERT(info != nullptr);
    info->split(path.last(), orientation, new QDockWidgetItem(dockWidget));

    removePlaceHolder(dockWidget->objectName());
}